

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatinbuilder.cpp
# Opt level: O0

void __thiscall
icu_63::CollationFastLatinBuilder::addUniqueCE
          (CollationFastLatinBuilder *this,int64_t ce,UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t limit;
  uint uVar2;
  int64_t *list;
  int32_t i;
  UErrorCode *errorCode_local;
  int64_t ce_local;
  CollationFastLatinBuilder *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (((UVar1 == '\0') && (ce != 0)) && ((int)((ulong)ce >> 0x20) != 1)) {
    list = UVector64::getBuffer(&this->uniqueCEs);
    limit = UVector64::size(&this->uniqueCEs);
    uVar2 = anon_unknown_9::binarySearch(list,limit,ce & 0xffffffffffff3fffU);
    if ((int)uVar2 < 0) {
      UVector64::insertElementAt
                (&this->uniqueCEs,ce & 0xffffffffffff3fffU,uVar2 ^ 0xffffffff,errorCode);
    }
  }
  return;
}

Assistant:

void
CollationFastLatinBuilder::addUniqueCE(int64_t ce, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return; }
    if(ce == 0 || (uint32_t)(ce >> 32) == Collation::NO_CE_PRIMARY) { return; }
    ce &= ~(int64_t)Collation::CASE_MASK;  // blank out case bits
    int32_t i = binarySearch(uniqueCEs.getBuffer(), uniqueCEs.size(), ce);
    if(i < 0) {
        uniqueCEs.insertElementAt(ce, ~i, errorCode);
    }
}